

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::TriangleIntersection> *
pbrt::IntersectTriangle
          (optional<pbrt::TriangleIntersection> *__return_storage_ptr__,Ray *ray,Float tMax,
          Point3f *p0,Point3f *p1,Point3f *p2)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined8 uVar7;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  char cVar16;
  Vector3f *pVVar17;
  float *pfVar18;
  long lVar19;
  char cVar20;
  Vector3f *pVVar21;
  char cVar22;
  Vector3f *pVVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float local_18 [4];
  
  fVar34 = (p2->super_Tuple3<pbrt::Point3,_float>).x;
  fVar32 = (p2->super_Tuple3<pbrt::Point3,_float>).y;
  fVar37 = (p0->super_Tuple3<pbrt::Point3,_float>).x;
  fVar39 = (p0->super_Tuple3<pbrt::Point3,_float>).y;
  fVar10 = fVar34 - fVar37;
  fVar11 = fVar32 - fVar39;
  fVar44 = (p2->super_Tuple3<pbrt::Point3,_float>).z;
  fVar2 = (p0->super_Tuple3<pbrt::Point3,_float>).z;
  fVar12 = fVar44 - fVar2;
  fVar3 = (p1->super_Tuple3<pbrt::Point3,_float>).x;
  fVar4 = (p1->super_Tuple3<pbrt::Point3,_float>).y;
  fVar13 = fVar3 - fVar37;
  fVar14 = fVar4 - fVar39;
  fVar5 = (p1->super_Tuple3<pbrt::Point3,_float>).z;
  fVar15 = fVar5 - fVar2;
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)fVar14));
  auVar26 = vfmsub213ss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)fVar11),auVar25);
  auVar25 = vfnmadd231ss_avx512f(auVar25,ZEXT416((uint)fVar12),ZEXT416((uint)fVar14));
  auVar27 = vaddss_avx512f(auVar26,auVar25);
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar15));
  auVar26 = vfmsub213ss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)fVar13),auVar25);
  auVar25 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)fVar10),auVar25);
  fVar12 = auVar26._0_4_ + auVar25._0_4_;
  auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar10),
                            ZEXT416((uint)(fVar11 * fVar13)));
  auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)fVar11),
                             ZEXT416((uint)(fVar11 * fVar13)));
  auVar28 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar12 * fVar12)),auVar27,auVar27);
  auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
  auVar25 = vfmadd231ss_fma(auVar28,auVar25,auVar25);
  if ((auVar25._0_4_ == 0.0) && (!NAN(auVar25._0_4_))) goto LAB_003d497f;
  pVVar17 = &ray->d;
  auVar33._8_4_ = 0x7fffffff;
  auVar33._0_8_ = 0x7fffffff7fffffff;
  auVar33._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx(ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x),auVar33);
  uVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar8 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._4_4_ = uVar8;
  auVar26._0_4_ = uVar6;
  auVar26._8_8_ = 0;
  auVar26 = vandps_avx(auVar26,auVar33);
  auVar28 = vshufps_avx(auVar26,auVar26,0xf5);
  pfVar18 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  pfVar1 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  cVar16 = (auVar26._0_4_ <= auVar28._0_4_) + '\x01';
  if (auVar26._0_4_ < auVar25._0_4_) {
    cVar16 = (auVar25._0_4_ <= auVar28._0_4_) * '\x02';
  }
  cVar22 = cVar16 + '\x01';
  if (cVar22 == '\x03') {
    cVar22 = '\0';
  }
  cVar20 = cVar22 + '\x01';
  if (cVar20 == '\x03') {
    cVar20 = '\0';
  }
  pVVar21 = pVVar17;
  if ((cVar22 != '\0') && (pVVar21 = (Vector3f *)pfVar18, cVar22 != '\x01')) {
    pVVar21 = (Vector3f *)pfVar1;
  }
  pVVar23 = pVVar17;
  if ((cVar20 != '\0') && (pVVar23 = (Vector3f *)pfVar18, cVar20 != '\x01')) {
    pVVar23 = (Vector3f *)pfVar1;
  }
  fVar12 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  fVar10 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  fVar11 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  if ((cVar16 != '\0') && (pVVar17 = (Vector3f *)pfVar18, cVar16 != '\x01')) {
    pVVar17 = (Vector3f *)pfVar1;
  }
  fVar39 = fVar39 - fVar10;
  fVar37 = fVar37 - fVar12;
  fVar2 = fVar2 - fVar11;
  auVar25 = ZEXT416((uint)fVar37);
  if ((cVar22 != '\0') && (auVar25 = ZEXT416((uint)fVar39), cVar22 != '\x01')) {
    auVar25 = ZEXT416((uint)fVar2);
  }
  auVar26 = ZEXT416((uint)fVar37);
  if ((cVar20 != '\0') && (auVar26 = ZEXT416((uint)fVar39), cVar20 != '\x01')) {
    auVar26 = ZEXT416((uint)fVar2);
  }
  if ((cVar16 != '\0') && (fVar37 = fVar39, cVar16 != '\x01')) {
    fVar37 = fVar2;
  }
  fVar3 = fVar3 - fVar12;
  auVar41 = ZEXT416((uint)(fVar4 - fVar10));
  auVar29 = ZEXT416((uint)(fVar5 - fVar11));
  auVar28 = ZEXT416((uint)fVar3);
  if ((cVar22 != '\0') && (auVar28 = auVar41, cVar22 != '\x01')) {
    auVar28 = auVar29;
  }
  auVar43 = ZEXT416((uint)fVar3);
  if ((cVar20 != '\0') && (auVar43 = auVar41, cVar20 != '\x01')) {
    auVar43 = auVar29;
  }
  auVar31 = ZEXT416((uint)fVar3);
  if ((cVar16 != '\0') && (auVar31 = auVar41, cVar16 != '\x01')) {
    auVar31 = auVar29;
  }
  fVar34 = fVar34 - fVar12;
  auVar30 = ZEXT416((uint)(fVar32 - fVar10));
  auVar29 = ZEXT416((uint)(fVar44 - fVar11));
  auVar41 = ZEXT416((uint)fVar34);
  if ((cVar22 != '\0') && (auVar41 = auVar30, cVar22 != '\x01')) {
    auVar41 = auVar29;
  }
  auVar35 = ZEXT416((uint)fVar34);
  if ((cVar20 != '\0') && (auVar35 = auVar30, cVar20 != '\x01')) {
    auVar35 = auVar29;
  }
  fVar32 = (pVVar17->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar45 = ZEXT416((uint)fVar34);
  if ((cVar16 != '\0') && (auVar45 = auVar30, cVar16 != '\x01')) {
    auVar45 = auVar29;
  }
  auVar29 = vinsertps_avx(ZEXT416((uint)(pVVar21->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(pVVar23->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar30._8_4_ = 0x80000000;
  auVar30._0_8_ = 0x8000000080000000;
  auVar30._12_4_ = 0x80000000;
  auVar29 = vxorps_avx512vl(auVar29,auVar30);
  auVar42._4_4_ = fVar32;
  auVar42._0_4_ = fVar32;
  auVar42._8_4_ = fVar32;
  auVar42._12_4_ = fVar32;
  auVar29 = vdivps_avx(auVar29,auVar42);
  auVar46._4_4_ = fVar37;
  auVar46._0_4_ = fVar37;
  auVar46._8_4_ = fVar37;
  auVar46._12_4_ = fVar37;
  auVar25 = vinsertps_avx(auVar25,auVar26,0x10);
  auVar42 = vfmadd231ps_fma(auVar25,auVar29,auVar46);
  auVar30 = vshufps_avx(auVar29,auVar29,0xe1);
  auVar25 = vinsertps_avx(auVar31,auVar45,0x10);
  auVar26 = vinsertps_avx(auVar43,auVar41,0x10);
  auVar43 = vfmadd231ps_fma(auVar26,auVar25,auVar30);
  auVar41 = vmovshdup_avx(auVar43);
  auVar26 = vinsertps_avx(auVar28,auVar35,0x10);
  auVar29 = vfmadd231ps_fma(auVar26,auVar29,auVar25);
  auVar28 = vmovshdup_avx(auVar29);
  auVar25 = vshufps_avx(auVar42,auVar42,0xe1);
  auVar35._0_4_ = auVar29._0_4_ * auVar25._0_4_;
  auVar35._4_4_ = auVar29._4_4_ * auVar25._4_4_;
  auVar35._8_4_ = auVar29._8_4_ * auVar25._8_4_;
  auVar35._12_4_ = auVar29._12_4_ * auVar25._12_4_;
  auVar25 = vblendps_avx(auVar42,auVar43,2);
  auVar26 = vblendps_avx(auVar43,auVar42,2);
  auVar30 = vfmsub213ps_fma(auVar26,auVar25,auVar35);
  auVar25 = vinsertps_avx(auVar29,auVar42,0x4c);
  auVar26 = vinsertps_avx(auVar29,auVar42,0x1c);
  auVar26 = vfnmadd213ps_fma(auVar26,auVar25,auVar35);
  auVar25._0_4_ = auVar26._0_4_ + auVar30._0_4_;
  auVar25._4_4_ = auVar26._4_4_ + auVar30._4_4_;
  auVar25._8_4_ = auVar26._8_4_ + auVar30._8_4_;
  auVar25._12_4_ = auVar26._12_4_ + auVar30._12_4_;
  if ((auVar25._0_4_ != 0.0) || (NAN(auVar25._0_4_))) {
    auVar30 = ZEXT416((uint)(auVar41._0_4_ * auVar43._0_4_));
    auVar26 = vfmsub213ss_fma(auVar28,auVar29,auVar30);
    auVar30 = vfnmadd231ss_fma(auVar30,auVar43,auVar41);
    fVar34 = auVar26._0_4_ + auVar30._0_4_;
    auVar38 = ZEXT416((uint)fVar34);
    if ((fVar34 == 0.0) && (!NAN(fVar34))) goto LAB_003d48f5;
    auVar26 = vmovshdup_avx(auVar25);
    if ((auVar26._0_4_ == 0.0) && (!NAN(auVar26._0_4_))) goto LAB_003d48f5;
  }
  else {
LAB_003d48f5:
    auVar25 = vcvtps2pd_avx(auVar43);
    auVar26 = vcvtps2pd_avx(auVar29);
    auVar30 = vshufpd_avx(auVar25,auVar25,1);
    auVar35 = vshufpd_avx(auVar26,auVar26,1);
    dVar9 = auVar35._0_8_ * auVar26._0_8_ - auVar30._0_8_ * auVar25._0_8_;
    auVar38._0_4_ = (float)dVar9;
    auVar38._4_4_ = (int)((ulong)dVar9 >> 0x20);
    auVar38._8_8_ = 0;
    auVar30 = vcvtps2pd_avx(auVar42);
    auVar35 = vshufpd_avx(auVar30,auVar30,1);
    auVar40._0_8_ = auVar35._0_8_ * auVar26._0_8_;
    auVar40._8_8_ = auVar35._8_8_ * auVar26._8_8_;
    auVar36._0_8_ = auVar30._0_8_ * auVar25._0_8_;
    auVar36._8_8_ = auVar30._8_8_ * auVar25._8_8_;
    auVar25 = vsubpd_avx(auVar36,auVar40);
    auVar25 = vcvtpd2ps_avx(auVar25);
  }
  fVar37 = auVar38._0_4_;
  auVar26 = vmovshdup_avx(auVar25);
  fVar34 = auVar25._0_4_;
  fVar39 = auVar26._0_4_;
  if ((((0.0 <= fVar37) && (0.0 <= fVar39)) && (bVar24 = 0.0 < fVar34, 0.0 <= fVar34)) ||
     (((fVar37 <= 0.0 && (fVar39 <= 0.0)) && (bVar24 = fVar34 < 0.0, fVar34 <= 0.0)))) {
    auVar26 = vxorps_avx512vl(auVar27,auVar27);
    auVar26 = vucomiss_avx512f(auVar26);
    if ((fVar34 != 0.0) || (NAN(fVar34))) {
      auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(1.0 / fVar32)));
      auVar27 = vinsertps_avx(auVar46,auVar31,0x10);
      auVar31 = vmulps_avx512vl(auVar30,auVar27);
      auVar27._0_4_ = auVar31._0_4_ * fVar34;
      auVar27._4_4_ = auVar31._4_4_ * auVar25._4_4_;
      auVar27._8_4_ = auVar31._8_4_ * auVar25._8_4_;
      auVar27._12_4_ = auVar31._12_4_ * auVar25._12_4_;
      auVar27 = vmovshdup_avx(auVar27);
      auVar27 = vfmadd231ss_fma(auVar27,auVar38,auVar31);
      auVar30 = ZEXT416((uint)((1.0 / fVar32) * auVar45._0_4_));
      auVar27 = vfmadd231ss_fma(auVar27,auVar25,auVar30);
      vucomiss_avx512f(auVar26);
      fVar32 = auVar26._0_4_;
      fVar44 = auVar27._0_4_;
      if (((bVar24 || fVar34 == 0.0) || ((fVar44 < 0.0 && (fVar32 * tMax <= fVar44)))) &&
         ((fVar32 <= 0.0 || ((0.0 < fVar44 && (fVar44 <= fVar32 * tMax)))))) {
        fVar32 = 1.0 / fVar32;
        auVar26 = vandps_avx(auVar31,auVar33);
        auVar27 = vandps_avx(auVar30,auVar33);
        pfVar18 = local_18;
        uVar7 = vmovlps_avx(auVar26);
        local_18[0] = (float)uVar7;
        local_18[1] = (float)((ulong)uVar7 >> 0x20);
        local_18[2] = (float)auVar27._0_4_;
        lVar19 = 4;
        do {
          if (*pfVar18 < *(float *)((long)local_18 + lVar19)) {
            pfVar18 = (float *)((long)local_18 + lVar19);
          }
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0xc);
        fVar2 = *pfVar18;
        auVar26 = vandps_avx(auVar41,auVar33);
        auVar27 = vunpcklps_avx(auVar42,auVar29);
        auVar27 = vandps_avx(auVar27,auVar33);
        pfVar18 = local_18;
        uVar7 = vmovlps_avx(auVar27);
        local_18[0] = (float)uVar7;
        local_18[1] = (float)((ulong)uVar7 >> 0x20);
        local_18[2] = (float)auVar26._0_4_;
        lVar19 = 4;
        do {
          if (*pfVar18 < *(float *)((long)local_18 + lVar19)) {
            pfVar18 = (float *)((long)local_18 + lVar19);
          }
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0xc);
        fVar3 = *pfVar18;
        auVar26 = vandps_avx(auVar28,auVar33);
        auVar27 = vpermt2ps_avx512vl(auVar43,SUB6416(ZEXT464(5),0),auVar42);
        auVar27 = vandps_avx(auVar27,auVar33);
        pfVar18 = local_18;
        uVar7 = vmovlps_avx(auVar27);
        local_18[0] = (float)uVar7;
        local_18[1] = (float)((ulong)uVar7 >> 0x20);
        local_18[2] = (float)auVar26._0_4_;
        lVar19 = 4;
        do {
          if (*pfVar18 < *(float *)((long)local_18 + lVar19)) {
            pfVar18 = (float *)((long)local_18 + lVar19);
          }
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0xc);
        fVar4 = *pfVar18;
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (fVar2 + fVar4) * 2.980233e-07)),
                                  ZEXT416((uint)fVar4),ZEXT416((uint)(fVar3 * 1.192093e-07)));
        auVar27 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar4),
                                  ZEXT416((uint)((fVar3 + fVar2) * 2.980233e-07)));
        auVar26 = vandps_avx(auVar38,auVar33);
        pfVar18 = local_18;
        local_18[0] = auVar26._0_4_;
        auVar25 = vshufps_avx(auVar25,auVar25,0xe1);
        auVar25 = vandps_avx(auVar25,auVar33);
        uVar7 = vmovlps_avx(auVar25);
        local_18[1] = (float)uVar7;
        local_18[2] = (float)((ulong)uVar7 >> 0x20);
        lVar19 = 4;
        do {
          if (*pfVar18 < *(float *)((long)local_18 + lVar19)) {
            pfVar18 = (float *)((long)local_18 + lVar19);
          }
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0xc);
        auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (auVar27._0_4_ + auVar27._0_4_))),
                                  ZEXT416((uint)fVar2),ZEXT416((uint)(*pfVar18 * 1.7881396e-07)));
        auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)*pfVar18),
                                  ZEXT416((uint)(fVar2 * 1.7881396e-07)));
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar26 = vandps_avx512vl(ZEXT416((uint)fVar32),auVar28);
        if (auVar26._0_4_ * auVar25._0_4_ * 3.0 < fVar44 * fVar32) {
          __return_storage_ptr__->set = true;
          *(float *)&__return_storage_ptr__->optionalValue = fVar37 * fVar32;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = fVar39 * fVar32;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar34 * fVar32;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar44 * fVar32;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_003d497f:
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined4 *)&__return_storage_ptr__->set = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<TriangleIntersection> IntersectTriangle(const Ray &ray, Float tMax,
                                                       const Point3f &p0,
                                                       const Point3f &p1,
                                                       const Point3f &p2) {
    // Return no intersection if triangle is degenerate
    if (LengthSquared(Cross(p2 - p0, p1 - p0)) == 0)
        return {};

    // Transform triangle vertices to ray coordinate space
    // Translate vertices based on ray origin
    Point3f p0t = p0 - Vector3f(ray.o);
    Point3f p1t = p1 - Vector3f(ray.o);
    Point3f p2t = p2 - Vector3f(ray.o);

    // Permute components of triangle vertices and ray direction
    int kz = MaxComponentIndex(Abs(ray.d));
    int kx = kz + 1;
    if (kx == 3)
        kx = 0;
    int ky = kx + 1;
    if (ky == 3)
        ky = 0;
    Vector3f d = Permute(ray.d, {kx, ky, kz});
    p0t = Permute(p0t, {kx, ky, kz});
    p1t = Permute(p1t, {kx, ky, kz});
    p2t = Permute(p2t, {kx, ky, kz});

    // Apply shear transformation to translated vertex positions
    Float Sx = -d.x / d.z;
    Float Sy = -d.y / d.z;
    Float Sz = 1.f / d.z;
    p0t.x += Sx * p0t.z;
    p0t.y += Sy * p0t.z;
    p1t.x += Sx * p1t.z;
    p1t.y += Sy * p1t.z;
    p2t.x += Sx * p2t.z;
    p2t.y += Sy * p2t.z;

    // Compute edge function coefficients _e0_, _e1_, and _e2_
    Float e0 = DifferenceOfProducts(p1t.x, p2t.y, p1t.y, p2t.x);
    Float e1 = DifferenceOfProducts(p2t.x, p0t.y, p2t.y, p0t.x);
    Float e2 = DifferenceOfProducts(p0t.x, p1t.y, p0t.y, p1t.x);

    // Fall back to double precision test at triangle edges
    if (sizeof(Float) == sizeof(float) && (e0 == 0.0f || e1 == 0.0f || e2 == 0.0f)) {
        double p2txp1ty = (double)p2t.x * (double)p1t.y;
        double p2typ1tx = (double)p2t.y * (double)p1t.x;
        e0 = (float)(p2typ1tx - p2txp1ty);
        double p0txp2ty = (double)p0t.x * (double)p2t.y;
        double p0typ2tx = (double)p0t.y * (double)p2t.x;
        e1 = (float)(p0typ2tx - p0txp2ty);
        double p1txp0ty = (double)p1t.x * (double)p0t.y;
        double p1typ0tx = (double)p1t.y * (double)p0t.x;
        e2 = (float)(p1typ0tx - p1txp0ty);
    }

    // Perform triangle edge and determinant tests
    if ((e0 < 0 || e1 < 0 || e2 < 0) && (e0 > 0 || e1 > 0 || e2 > 0))
        return {};
    Float det = e0 + e1 + e2;
    if (det == 0)
        return {};

    // Compute scaled hit distance to triangle and test against ray $t$ range
    p0t.z *= Sz;
    p1t.z *= Sz;
    p2t.z *= Sz;
    Float tScaled = e0 * p0t.z + e1 * p1t.z + e2 * p2t.z;
    if (det < 0 && (tScaled >= 0 || tScaled < tMax * det))
        return {};
    else if (det > 0 && (tScaled <= 0 || tScaled > tMax * det))
        return {};

    // Compute barycentric coordinates and $t$ value for triangle intersection
    Float invDet = 1 / det;
    Float b0 = e0 * invDet, b1 = e1 * invDet, b2 = e2 * invDet;
    Float t = tScaled * invDet;
    DCHECK(!IsNaN(t));

    // Ensure that computed triangle $t$ is conservatively greater than zero
    // Compute $\delta_z$ term for triangle $t$ error bounds
    Float maxZt = MaxComponentValue(Abs(Vector3f(p0t.z, p1t.z, p2t.z)));
    Float deltaZ = gamma(3) * maxZt;

    // Compute $\delta_x$ and $\delta_y$ terms for triangle $t$ error bounds
    Float maxXt = MaxComponentValue(Abs(Vector3f(p0t.x, p1t.x, p2t.x)));
    Float maxYt = MaxComponentValue(Abs(Vector3f(p0t.y, p1t.y, p2t.y)));
    Float deltaX = gamma(5) * (maxXt + maxZt);
    Float deltaY = gamma(5) * (maxYt + maxZt);

    // Compute $\delta_e$ term for triangle $t$ error bounds
    Float deltaE = 2 * (gamma(2) * maxXt * maxYt + deltaY * maxXt + deltaX * maxYt);

    // Compute $\delta_t$ term for triangle $t$ error bounds and check _t_
    Float maxE = MaxComponentValue(Abs(Vector3f(e0, e1, e2)));
    Float deltaT =
        3 * (gamma(3) * maxE * maxZt + deltaE * maxZt + deltaZ * maxE) * std::abs(invDet);
    if (t <= deltaT)
        return {};

    // Return _TriangleIntersection_ for intersection
    return TriangleIntersection{b0, b1, b2, t};
}